

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O0

unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> __thiscall
Diligent::ShaderCodeBufferDescX::
PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
          (ShaderCodeBufferDescX *this,
          __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
          RangeStart,
          __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
          RangeEnd,IMemoryAllocator *RawAllocator)

{
  bool bVar1;
  void *__p;
  ShaderCodeBufferDesc *Args_1;
  Char *Message;
  pointer pSVar2;
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  ShaderCodeBufferDesc SVar3;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> uVar4;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  local_d0;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  Refl_1;
  string msg;
  ShaderCodeBufferDesc *pRefl;
  undefined1 local_95;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  local_88;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  Refl;
  difference_type Size;
  FixedLinearAllocator Allocator;
  IMemoryAllocator *RawAllocator_local;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  RangeEnd_local;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  RangeStart_local;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *DataBuffer;
  
  Allocator._72_8_ = RawAllocator;
  RawAllocator_local = (IMemoryAllocator *)RangeEnd._M_current;
  RangeEnd_local = RangeStart;
  FixedLinearAllocator::FixedLinearAllocator((FixedLinearAllocator *)&Size,RawAllocator);
  Refl._M_current =
       (ShaderCodeBufferDescX *)
       __gnu_cxx::operator-
                 ((__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                   *)&RawAllocator_local,&RangeEnd_local);
  FixedLinearAllocator::AddSpace<Diligent::ShaderCodeBufferDesc>
            ((FixedLinearAllocator *)&Size,(size_t)Refl._M_current);
  local_88._M_current = RangeEnd_local._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&local_88,
                            (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                             *)&RawAllocator_local), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
             ::operator->(&local_88);
    ReserveSpace(pSVar2,(FixedLinearAllocator *)&Size);
    __gnu_cxx::
    __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
    ::operator++(&local_88);
  }
  FixedLinearAllocator::Reserve((FixedLinearAllocator *)&Size);
  local_95 = 0;
  __p = FixedLinearAllocator::ReleaseOwnership((FixedLinearAllocator *)&Size);
  STDDeleter<void,_Diligent::IMemoryAllocator>::STDDeleter
            ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&pRefl,
             (IMemoryAllocator *)Allocator._72_8_);
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
            ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)this,__p,
             (STDDeleter<void,_Diligent::IMemoryAllocator> *)&pRefl);
  msg.field_2._8_8_ =
       FixedLinearAllocator::ConstructArray<Diligent::ShaderCodeBufferDesc>
                 ((FixedLinearAllocator *)&Size,(size_t)Refl._M_current);
  Args_1 = (ShaderCodeBufferDesc *)
           std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::get
                     ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
                      this);
  if ((ShaderCodeBufferDesc *)msg.field_2._8_8_ != Args_1) {
    FormatString<char[26],char[26]>
              ((string *)&Refl_1,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pRefl == DataBuffer.get()",(char (*) [26])Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"PackArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/ShaderToolsCommon.hpp"
               ,0x172);
    std::__cxx11::string::~string((string *)&Refl_1);
  }
  local_d0._M_current = RangeEnd_local._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&local_d0,
                            (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                             *)&RawAllocator_local), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
             ::operator->(&local_d0);
    SVar3 = MakeCopy(pSVar2,(FixedLinearAllocator *)&Size);
    *(ShaderCodeBufferDesc *)msg.field_2._8_8_ = SVar3;
    __gnu_cxx::
    __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
    ::operator++(&local_d0);
    msg.field_2._8_8_ = msg.field_2._8_8_ + 0x10;
  }
  local_95 = 1;
  FixedLinearAllocator::~FixedLinearAllocator((FixedLinearAllocator *)&Size);
  uVar4._M_t.super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  _M_t.super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar4._M_t.super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  _M_t.super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl.
  m_Allocator = (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)
                (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)this
  ;
  return (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>)
         uVar4._M_t.
         super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
         super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>;
}

Assistant:

static std::unique_ptr<void, STDDeleterRawMem<void>> PackArray(IterType RangeStart, IterType RangeEnd, IMemoryAllocator& RawAllocator)
    {
        FixedLinearAllocator Allocator{RawAllocator};

        const auto Size = RangeEnd - RangeStart;
        Allocator.AddSpace<ShaderCodeBufferDesc>(Size);
        for (auto Refl = RangeStart; Refl != RangeEnd; ++Refl)
            Refl->ReserveSpace(Allocator);

        Allocator.Reserve();
        std::unique_ptr<void, STDDeleterRawMem<void>> DataBuffer{Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

        auto* pRefl = Allocator.ConstructArray<ShaderCodeBufferDesc>(Size);
        VERIFY_EXPR(pRefl == DataBuffer.get());
        for (auto Refl = RangeStart; Refl != RangeEnd; ++Refl)
            *(pRefl++) = Refl->MakeCopy(Allocator);

        return DataBuffer;
    }